

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.h
# Opt level: O2

QString * fixEnvVariables(QString *__return_storage_ptr__,QString *x)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QString string;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (x->d).d;
  pcVar3 = (x->d).ptr;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  string.d.ptr = (char16_t *)pDVar2;
  string.d.d = (Data *)in_stack_ffffffffffffffc8;
  string.d.size = (qsizetype)pcVar3;
  Option::fixString(__return_storage_ptr__,string,
                    (uchar)(QArrayDataPointer<char16_t> *)&stack0xffffffffffffffd0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QString fixEnvVariables(const QString &x) { return Option::fixString(x, Option::FixEnvVars); }